

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processInstrWithTwoReg(Assembler *this,string *instruction,int reg)

{
  string local_40;
  int local_1c;
  string *psStack_18;
  int reg_local;
  string *instruction_local;
  Assembler *this_local;
  
  local_1c = reg;
  psStack_18 = instruction;
  instruction_local = &this->inputFileName;
  std::__cxx11::string::string((string *)&local_40,(string *)instruction);
  instr2Bytes(this,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Assembler::processInstrWithTwoReg(string instruction, int reg) {
    instr2Bytes(instruction, reg);
}